

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::Expression::bindRValue
          (Expression *this,Type *lhs,ExpressionSyntax *rhs,SourceRange assignmentRange,
          ASTContext *context,bitmask<slang::ast::ASTFlags> extraFlags)

{
  Compilation *compilation;
  bool bVar1;
  Type *type;
  InstanceSymbolBase *pIVar2;
  Expression *pEVar3;
  SourceLocation assignFlags;
  SourceLocation SVar4;
  SourceRange assignmentRange_00;
  ASTContext ctx;
  ASTContext local_68;
  
  SVar4 = assignmentRange.endLoc;
  assignFlags = assignmentRange.startLoc;
  compilation = (Compilation *)**(undefined8 **)SVar4;
  ASTContext::resetFlags(&local_68,(ASTContext *)SVar4,(bitmask<slang::ast::ASTFlags>)context);
  bVar1 = Type::isVirtualInterfaceOrArray((Type *)this);
  if ((bVar1) &&
     (type = (Type *)tryBindInterfaceRef(&local_68,(ExpressionSyntax *)lhs,false),
     type != (Type *)0x0)) {
    SVar4 = assignFlags;
    if (((ulong)rhs & 0xfffffff) == 0) {
      rhs = *(ExpressionSyntax **)&((SourceRange *)&(type->super_Symbol).parentScope)->startLoc;
      SVar4 = *(SourceLocation *)&(type->super_Symbol).nextInScope;
    }
  }
  else {
    pIVar2 = ASTContext::getInstance((ASTContext *)SVar4);
    if ((pIVar2 == (InstanceSymbolBase *)0x0) ||
       ((pIVar2->arrayPath)._M_extent._M_extent_value == 0)) {
      context = (ASTContext *)((ulong)context | 0x80);
    }
    type = (Type *)create(compilation,(ExpressionSyntax *)lhs,&local_68,
                          (bitmask<slang::ast::ASTFlags>)context,(Type *)this);
    SVar4 = assignFlags;
    if (((ulong)rhs & 0xfffffff) == 0) {
      rhs = *(ExpressionSyntax **)&((SourceRange *)&(type->super_Symbol).parentScope)->startLoc;
      SVar4 = *(SourceLocation *)&(type->super_Symbol).nextInScope;
    }
  }
  assignmentRange_00.endLoc = (SourceLocation)0x0;
  assignmentRange_00.startLoc = SVar4;
  pEVar3 = convertAssignment((Expression *)&local_68,(ASTContext *)this,type,(Expression *)rhs,
                             assignmentRange_00,(Expression **)0x0,
                             (bitmask<slang::ast::AssignFlags> *)assignFlags);
  return pEVar3;
}

Assistant:

const Expression& Expression::bindRValue(const Type& lhs, const ExpressionSyntax& rhs,
                                         SourceRange assignmentRange, const ASTContext& context,
                                         bitmask<ASTFlags> extraFlags) {
    Compilation& comp = context.getCompilation();

    ASTContext ctx = context.resetFlags(extraFlags);
    if (lhs.isVirtualInterfaceOrArray()) {
        if (auto ref = tryBindInterfaceRef(ctx, rhs, /* isInterfacePort */ false)) {
            if (!assignmentRange.start())
                assignmentRange = ref->sourceRange;
            return convertAssignment(ctx, lhs, *ref, assignmentRange);
        }
    }

    auto instance = context.getInstance();
    if (!instance || instance->arrayPath.empty())
        extraFlags |= ASTFlags::StreamingAllowed;

    Expression& expr = create(comp, rhs, ctx, extraFlags, &lhs);
    if (!assignmentRange.start())
        assignmentRange = expr.sourceRange;

    return convertAssignment(ctx, lhs, expr, assignmentRange);
}